

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int aom_denoise_and_model_run
              (aom_denoise_and_model_t *ctx,YV12_BUFFER_CONFIG *sd,aom_film_grain_t *film_grain,
              int apply_denoise)

{
  uint8_t **denoised;
  aom_noise_model_t *noise_model;
  int stride;
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  aom_film_grain_t *film_grain_00;
  aom_noise_status_t aVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint8_t *puVar9;
  sbyte sVar10;
  uint8_t *data_00;
  uint8_t *__dest;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint use_highbd;
  ulong uVar14;
  float fVar15;
  float fVar16;
  aom_noise_model_params_t params;
  int strides [3];
  undefined8 local_60;
  uint8_t *local_58;
  aom_film_grain_t *local_50;
  uint8_t *data [3];
  
  uVar13 = sd->flags;
  data_00 = (sd->field_5).field_0.y_buffer;
  uVar11 = uVar13 & 8;
  if (uVar11 == 0) {
    local_58 = (sd->field_5).field_0.u_buffer;
    __dest = (sd->field_5).field_0.v_buffer;
  }
  else {
    data_00 = (uint8_t *)((long)data_00 * 2);
    local_58 = (uint8_t *)((long)(sd->field_5).field_0.u_buffer * 2);
    __dest = (uint8_t *)((long)(sd->field_5).field_0.v_buffer * 2);
  }
  iVar8 = ctx->block_size;
  stride = (sd->field_4).field_0.y_stride;
  iVar1 = (sd->field_4).field_0.uv_stride;
  local_60._0_4_ = sd->subsampling_x;
  local_60._4_4_ = sd->subsampling_y;
  iVar7 = (sd->field_0).field_0.y_width;
  strides[0] = stride;
  strides[1] = iVar1;
  strides[2] = iVar1;
  local_50 = film_grain;
  data[0] = data_00;
  data[1] = local_58;
  data[2] = __dest;
  if ((((ctx->width != iVar7) || (ctx->height != (sd->field_1).field_0.y_height)) ||
      (ctx->y_stride != stride)) || (ctx->uv_stride != iVar1)) {
    ctx->width = iVar7;
    ctx->height = (sd->field_1).field_0.y_height;
    ctx->y_stride = (sd->field_4).field_0.y_stride;
    ctx->uv_stride = (sd->field_4).field_0.uv_stride;
    lVar12 = 8;
    do {
      aom_free(ctx->noise_psd[lVar12 + -5]);
      ctx->noise_psd[lVar12 + -5] = (float *)0x0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xb);
    uVar13 = uVar13 >> 3;
    use_highbd = uVar13 & 1;
    aom_free(ctx->flat_blocks);
    ctx->flat_blocks = (uint8_t *)0x0;
    sVar10 = (sbyte)use_highbd;
    puVar9 = (uint8_t *)
             aom_malloc((long)((sd->field_1).field_0.y_height * (sd->field_4).field_0.y_stride <<
                              sVar10));
    ctx->denoised[0] = puVar9;
    puVar9 = (uint8_t *)
             aom_malloc((long)((sd->field_1).field_0.uv_height * (sd->field_4).field_0.uv_stride <<
                              sVar10));
    ctx->denoised[1] = puVar9;
    puVar9 = (uint8_t *)
             aom_malloc((long)((sd->field_1).field_0.uv_height * (sd->field_4).field_0.uv_stride <<
                              sVar10));
    ctx->denoised[2] = puVar9;
    if (((ctx->denoised[0] == (uint8_t *)0x0) || (ctx->denoised[1] == (uint8_t *)0x0)) ||
       (puVar9 == (uint8_t *)0x0)) {
      aom_denoise_and_model_run_cold_4();
LAB_0016bc3c:
      aom_denoise_and_model_run_cold_5();
      return 0;
    }
    iVar7 = ctx->block_size;
    iVar6 = ((sd->field_0).field_0.y_width + iVar7 + -1) / iVar7;
    ctx->num_blocks_w = iVar6;
    iVar7 = (iVar7 + -1 + (sd->field_1).field_0.y_height) / iVar7;
    ctx->num_blocks_h = iVar7;
    puVar9 = (uint8_t *)aom_malloc((long)(iVar7 * iVar6));
    ctx->flat_blocks = puVar9;
    if (puVar9 == (uint8_t *)0x0) {
      aom_denoise_and_model_run_cold_3();
      goto LAB_0016bc3c;
    }
    aom_free((ctx->flat_block_finder).A);
    aom_free((ctx->flat_block_finder).AtA_inv);
    (ctx->flat_block_finder).num_params = 0;
    (ctx->flat_block_finder).block_size = 0;
    (ctx->flat_block_finder).normalization = 0.0;
    (ctx->flat_block_finder).AtA_inv = (double *)0x0;
    (ctx->flat_block_finder).A = (double *)0x0;
    *(undefined8 *)&(ctx->flat_block_finder).use_highbd = 0;
    iVar7 = aom_flat_block_finder_init
                      (&ctx->flat_block_finder,ctx->block_size,ctx->bit_depth,use_highbd);
    if (iVar7 == 0) {
      aom_denoise_and_model_run_cold_2();
      goto LAB_0016bc3c;
    }
    uVar14 = CONCAT44(uVar13,ctx->bit_depth) & 0x1ffffffff;
    aom_noise_model_free(&ctx->noise_model);
    params.bit_depth = (int)uVar14;
    params.use_highbd = (int)(uVar14 >> 0x20);
    params.shape = '\x01';
    params._1_3_ = 0;
    params.lag = 3;
    iVar7 = aom_noise_model_init(&ctx->noise_model,params);
    if (iVar7 == 0) {
      aom_denoise_and_model_run_cold_1();
      goto LAB_0016bc3c;
    }
    fVar15 = aom_noise_psd_get_default_value(ctx->block_size,ctx->noise_level);
    fVar16 = aom_noise_psd_get_default_value
                       (ctx->block_size >> ((byte)sd->subsampling_x & 0x1f),ctx->noise_level);
    if (iVar8 != 0) {
      pfVar2 = ctx->noise_psd[0];
      pfVar3 = ctx->noise_psd[1];
      pfVar4 = ctx->noise_psd[2];
      uVar14 = 0;
      do {
        pfVar2[uVar14] = fVar15;
        pfVar4[uVar14] = fVar16;
        pfVar3[uVar14] = fVar16;
        uVar14 = uVar14 + 1;
      } while (iVar8 * iVar8 + (uint)(iVar8 * iVar8 == 0) != uVar14);
    }
  }
  uVar11 = uVar11 >> 3;
  aom_flat_block_finder_run
            (&ctx->flat_block_finder,data_00,(sd->field_0).field_0.y_width,
             (sd->field_1).field_0.y_height,stride,ctx->flat_blocks);
  denoised = ctx->denoised;
  iVar7 = aom_wiener_denoise_2d
                    (data,denoised,(sd->field_0).field_0.y_width,(sd->field_1).field_0.y_height,
                     strides,(int *)&local_60,ctx->noise_psd,iVar8,ctx->bit_depth,uVar11);
  if (iVar7 == 0) {
    aom_denoise_and_model_run_cold_7();
    return 0;
  }
  noise_model = &ctx->noise_model;
  aVar5 = aom_noise_model_update
                    (noise_model,data,denoised,(sd->field_0).field_0.y_width,
                     (sd->field_1).field_0.y_height,strides,(int *)&local_60,ctx->flat_blocks,iVar8)
  ;
  film_grain_00 = local_50;
  if (aVar5 != '\0') {
    if (aVar5 != '\x03') {
      iVar8 = (ctx->noise_model).combined_state[0].strength_solver.num_equations;
      local_50->apply_grain = 0;
      if (iVar8 < 1) {
        return 1;
      }
      goto LAB_0016bb72;
    }
    aom_noise_model_save_latest(noise_model);
  }
  film_grain_00->apply_grain = 0;
LAB_0016bb72:
  iVar8 = aom_noise_model_get_grain_parameters(noise_model,film_grain_00);
  if (iVar8 == 0) {
    aom_denoise_and_model_run_cold_6();
    return 0;
  }
  if (film_grain_00->random_seed == 0) {
    film_grain_00->random_seed = 0x1cdf;
  }
  if (apply_denoise != 0) {
    sVar10 = (sbyte)uVar11;
    memcpy(data_00,*denoised,(long)(stride * (sd->field_1).field_0.y_height << sVar10));
    if (sd->monochrome == '\0') {
      memcpy(local_58,ctx->denoised[1],(long)((sd->field_1).field_0.uv_height * iVar1 << sVar10));
      memcpy(__dest,ctx->denoised[2],(long)(iVar1 * (sd->field_1).field_0.uv_height << sVar10));
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

int aom_denoise_and_model_run(struct aom_denoise_and_model_t *ctx,
                              const YV12_BUFFER_CONFIG *sd,
                              aom_film_grain_t *film_grain, int apply_denoise) {
  const int block_size = ctx->block_size;
  const int use_highbd = (sd->flags & YV12_FLAG_HIGHBITDEPTH) != 0;
  uint8_t *raw_data[3] = {
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->y_buffer) : sd->y_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->u_buffer) : sd->u_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->v_buffer) : sd->v_buffer,
  };
  const uint8_t *const data[3] = { raw_data[0], raw_data[1], raw_data[2] };
  int strides[3] = { sd->y_stride, sd->uv_stride, sd->uv_stride };
  int chroma_sub_log2[2] = { sd->subsampling_x, sd->subsampling_y };

  if (!denoise_and_model_realloc_if_necessary(ctx, sd)) {
    fprintf(stderr, "Unable to realloc buffers\n");
    return 0;
  }

  aom_flat_block_finder_run(&ctx->flat_block_finder, data[0], sd->y_width,
                            sd->y_height, strides[0], ctx->flat_blocks);

  if (!aom_wiener_denoise_2d(data, ctx->denoised, sd->y_width, sd->y_height,
                             strides, chroma_sub_log2, ctx->noise_psd,
                             block_size, ctx->bit_depth, use_highbd)) {
    fprintf(stderr, "Unable to denoise image\n");
    return 0;
  }

  const aom_noise_status_t status = aom_noise_model_update(
      &ctx->noise_model, data, (const uint8_t *const *)ctx->denoised,
      sd->y_width, sd->y_height, strides, chroma_sub_log2, ctx->flat_blocks,
      block_size);
  int have_noise_estimate = 0;
  if (status == AOM_NOISE_STATUS_OK) {
    have_noise_estimate = 1;
  } else if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
    aom_noise_model_save_latest(&ctx->noise_model);
    have_noise_estimate = 1;
  } else {
    // Unable to update noise model; proceed if we have a previous estimate.
    have_noise_estimate =
        (ctx->noise_model.combined_state[0].strength_solver.num_equations > 0);
  }

  film_grain->apply_grain = 0;
  if (have_noise_estimate) {
    if (!aom_noise_model_get_grain_parameters(&ctx->noise_model, film_grain)) {
      fprintf(stderr, "Unable to get grain parameters.\n");
      return 0;
    }
    if (!film_grain->random_seed) {
      film_grain->random_seed = 7391;
    }
    if (apply_denoise) {
      memcpy(raw_data[0], ctx->denoised[0],
             (strides[0] * sd->y_height) << use_highbd);
      if (!sd->monochrome) {
        memcpy(raw_data[1], ctx->denoised[1],
               (strides[1] * sd->uv_height) << use_highbd);
        memcpy(raw_data[2], ctx->denoised[2],
               (strides[2] * sd->uv_height) << use_highbd);
      }
    }
  }
  return 1;
}